

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_bitrev_mips64(target_ulong rt)

{
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  uint32_t rd;
  int32_t temp;
  target_ulong rt_local;
  
  i = (uint)rt & 0xffff;
  local_18 = 0;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    local_18 = local_18 << 1 | i & 1U;
    i = i >> 1;
  }
  return (ulong)local_18;
}

Assistant:

target_ulong helper_bitrev(target_ulong rt)
{
    int32_t temp;
    uint32_t rd;
    int i;

    temp = rt & MIPSDSP_LO;
    rd = 0;
    for (i = 0; i < 16; i++) {
        rd = (rd << 1) | (temp & 1);
        temp = temp >> 1;
    }

    return (target_ulong)rd;
}